

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O2

void __thiscall
diy::Master::foreach<diy::detail::ReductionFunctor<void,diy::RegularSwapPartners>>
          (Master *this,ReductionFunctor<void,_diy::RegularSwapPartners> *f,Skip *s)

{
  Callback<void> CStack_38;
  
  std::function<void(void*,diy::Master::ProxyWithLink_const&)>::
  function<diy::detail::ReductionFunctor<void,diy::RegularSwapPartners>const&,void>
            ((function<void(void*,diy::Master::ProxyWithLink_const&)> *)&CStack_38,f);
  foreach_<void>(this,&CStack_38,s);
  Catch::clara::std::_Function_base::~_Function_base(&CStack_38.super__Function_base);
  return;
}

Assistant:

void          foreach(const F& f, const Skip& s = NeverSkip())
      {
          using Block = typename detail::block_traits<F>::type;
          foreach_<Block>(f, s);
      }